

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

size_t __thiscall
absl::lts_20240722::str_format_internal::(anonymous_namespace)::
PrintIntegralDigits<(absl::lts_20240722::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned__int128>
          (_anonymous_namespace_ *this,unsigned___int128 digits,Buffer *out)

{
  undefined1 auVar1 [16];
  Buffer *in_RDX;
  size_t sVar2;
  undefined1 auVar3 [16];
  
  auVar1._8_8_ = out;
  auVar1._0_8_ = this;
  if (this == (_anonymous_namespace_ *)0x0 && out == (Buffer *)0x0) {
    sVar2 = 0;
  }
  else {
    while( true ) {
      if (auVar1._0_8_ == 0 && auVar1._8_8_ == 0) break;
      auVar3 = __udivti3(auVar1._0_8_,auVar1._8_8_,10,0);
      anon_unknown_0::Buffer::push_front(in_RDX,auVar1[0] + auVar3[0] * -10 | 0x30);
      auVar1 = auVar3;
    }
    sVar2 = (long)in_RDX->end - (long)in_RDX->begin;
    anon_unknown_0::Buffer::push_front(in_RDX,*in_RDX->begin);
    in_RDX->begin[1] = '.';
  }
  return sVar2;
}

Assistant:

size_t PrintIntegralDigits(Int digits, Buffer* out) {
  size_t printed = 0;
  if (digits) {
    for (; digits; digits /= 10) out->push_front(digits % 10 + '0');
    printed = out->size();
    if (mode == FormatStyle::Precision) {
      out->push_front(*out->begin);
      out->begin[1] = '.';
    } else {
      out->push_back('.');
    }
  } else if (mode == FormatStyle::Fixed) {
    out->push_front('0');
    out->push_back('.');
    printed = 1;
  }
  return printed;
}